

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O0

int splittingStep_PrintAllStats(ARKodeMem ark_mem,FILE *outfile,SUNOutputFormat fmt)

{
  int k;
  char name_buf [29];
  int retval;
  ARKodeSplittingStepMem step_mem;
  ARKodeSplittingStepMem *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar1;
  int in_stack_ffffffffffffffa8;
  SUNOutputFormat in_stack_ffffffffffffffac;
  FILE *in_stack_ffffffffffffffb0;
  int local_4;
  
  local_4 = splittingStep_AccessStepMem
                      ((ARKodeMem)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98);
  if (local_4 == 0) {
    for (iVar1 = 0; iVar1 < iRam0000000000000018; iVar1 = iVar1 + 1) {
      snprintf(&stack0xffffffffffffffa8,0x1d,"Partition %i evolves",(ulong)(iVar1 + 1));
      sunfprintf_long(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                      (char *)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                      (long)in_stack_ffffffffffffff98);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int splittingStep_PrintAllStats(ARKodeMem ark_mem, FILE* outfile,
                                       SUNOutputFormat fmt)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  char name_buf[SUN_TABLE_WIDTH];
  for (int k = 0; k < step_mem->partitions; k++)
  {
    snprintf(name_buf, sizeof(name_buf), "Partition %i evolves", k + 1);
    sunfprintf_long(outfile, fmt, SUNFALSE, name_buf,
                    step_mem->n_stepper_evolves[k]);
  }

  return ARK_SUCCESS;
}